

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThreeAction.cpp
# Opt level: O0

ActionResults * __thiscall BlueRoomThreeAction::Throw(BlueRoomThreeAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *this_01;
  bool bVar3;
  allocator local_41;
  string local_40 [36];
  itemType local_1c;
  BlueRoomThreeAction *local_18;
  BlueRoomThreeAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  bVar3 = false;
  if (iVar1 == BALL) {
    local_1c = BALL;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_1c);
    iVar2 = ItemWrapper::getLocation(this_00);
    bVar3 = iVar2 == BACKPACK;
  }
  if (bVar3) {
    this_01 = (ActionResults *)operator_new(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "You throw the ball across the room. It clanks around the icy metal pipes for a bit, then rolls to a rest on the frozen floor."
               ,&local_41);
    ActionResults::ActionResults(this_01,CURRENT,(string *)local_40);
    this_local = (BlueRoomThreeAction *)this_01;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    this_local = (BlueRoomThreeAction *)AbstractRoomAction::Throw(&this->super_AbstractRoomAction);
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *BlueRoomThreeAction::Throw() {
    if(commands->getMainItem() == BALL && itemList->getValue(BALL)->getLocation() == BACKPACK){
        return new ActionResults(CURRENT, "You throw the ball across the room. It clanks around the icy metal pipes for a bit, then rolls to a rest on the frozen floor.");
    } else {
        return AbstractRoomAction::Throw();
    }
}